

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O1

void build_score(high_score *entry,player *p,char *died_from,time_t *death_time)

{
  tm *__tp;
  
  entry->how[0x10] = '\0';
  entry->how[0x11] = '\0';
  entry->how[0x12] = '\0';
  entry->how[0x13] = '\0';
  entry->how[0x14] = '\0';
  entry->how[0x15] = '\0';
  entry->how[0x16] = '\0';
  entry->how[0x17] = '\0';
  entry->how[0x18] = '\0';
  entry->how[0x19] = '\0';
  entry->how[0x1a] = '\0';
  entry->how[0x1b] = '\0';
  entry->how[0x1c] = '\0';
  entry->how[0x1d] = '\0';
  entry->how[0x1e] = '\0';
  entry->how[0x1f] = '\0';
  entry->how[2] = '\0';
  entry->how[3] = '\0';
  entry->how[4] = '\0';
  entry->how[5] = '\0';
  entry->how[6] = '\0';
  entry->how[7] = '\0';
  entry->how[8] = '\0';
  entry->how[9] = '\0';
  entry->how[10] = '\0';
  entry->how[0xb] = '\0';
  entry->how[0xc] = '\0';
  entry->how[0xd] = '\0';
  entry->how[0xe] = '\0';
  entry->how[0xf] = '\0';
  entry->how[0x10] = '\0';
  entry->how[0x11] = '\0';
  *(undefined8 *)(entry->cur_lev + 2) = 0;
  *(undefined8 *)(entry->max_lev + 2) = 0;
  entry->uid[0] = '\0';
  entry->uid[1] = '\0';
  entry->uid[2] = '\0';
  entry->uid[3] = '\0';
  entry->uid[4] = '\0';
  entry->uid[5] = '\0';
  entry->uid[6] = '\0';
  entry->uid[7] = '\0';
  entry->p_r[0] = '\0';
  entry->p_r[1] = '\0';
  entry->p_r[2] = '\0';
  entry->p_c[0] = '\0';
  entry->p_c[1] = '\0';
  entry->p_c[2] = '\0';
  entry->cur_lev[0] = '\0';
  entry->cur_lev[1] = '\0';
  entry->who[0] = '\0';
  entry->who[1] = '\0';
  entry->who[2] = '\0';
  entry->who[3] = '\0';
  entry->who[4] = '\0';
  entry->who[5] = '\0';
  entry->who[6] = '\0';
  entry->who[7] = '\0';
  entry->who[8] = '\0';
  entry->who[9] = '\0';
  entry->who[10] = '\0';
  entry->who[0xb] = '\0';
  entry->who[0xc] = '\0';
  entry->who[0xd] = '\0';
  entry->who[0xe] = '\0';
  entry->who[0xf] = '\0';
  *(undefined8 *)(entry->turns + 4) = 0;
  entry->day[2] = '\0';
  entry->day[3] = '\0';
  entry->day[4] = '\0';
  entry->day[5] = '\0';
  entry->day[6] = '\0';
  entry->day[7] = '\0';
  entry->day[8] = '\0';
  entry->day[9] = '\0';
  *(undefined8 *)(entry->pts + 8) = 0;
  *(undefined8 *)(entry->gold + 6) = 0;
  entry->what[0] = '\0';
  entry->what[1] = '\0';
  entry->what[2] = '\0';
  entry->what[3] = '\0';
  entry->what[4] = '\0';
  entry->what[5] = '\0';
  entry->what[6] = '\0';
  entry->what[7] = '\0';
  entry->pts[0] = '\0';
  entry->pts[1] = '\0';
  entry->pts[2] = '\0';
  entry->pts[3] = '\0';
  entry->pts[4] = '\0';
  entry->pts[5] = '\0';
  entry->pts[6] = '\0';
  entry->pts[7] = '\0';
  strnfmt(entry->what,8,"%s",buildid);
  strnfmt(entry->pts,10,"%9ld",(long)p->max_depth * 100 + (long)p->max_exp);
  strnfmt(entry->gold,10,"%9ld",(long)p->au);
  strnfmt(entry->turns,10,"%9ld",(long)turn);
  if (death_time == (time_t *)0x0) {
    my_strcpy(entry->day,"TODAY",10);
  }
  else {
    __tp = localtime(death_time);
    strftime(entry->day,10,"@%Y%m%d",__tp);
  }
  strnfmt(entry->who,0x10,"%-.15s",p->full_name);
  strnfmt(entry->uid,8,"%7u",(ulong)(uint)player_uid);
  strnfmt(entry->p_r,3,"%2d",(ulong)p->race->ridx);
  strnfmt(entry->p_c,3,"%2d",(ulong)p->class->cidx);
  strnfmt(entry->cur_lev,4,"%3d",(ulong)(uint)(int)p->lev);
  strnfmt(entry->cur_dun,4,"%3d",(ulong)(uint)(int)p->depth);
  strnfmt(entry->max_lev,4,"%3d",(ulong)(uint)(int)p->max_lev);
  strnfmt(entry->max_dun,4,"%3d",(ulong)(uint)(int)p->max_depth);
  my_strcpy(entry->how,died_from,0x20);
  return;
}

Assistant:

void build_score(struct high_score *entry, const struct player *p,
		const char *died_from, const time_t *death_time)
{
	memset(entry, 0, sizeof(struct high_score));

	/* Save the version */
	strnfmt(entry->what, sizeof(entry->what), "%s", buildid);

	/* Calculate and save the points */
	strnfmt(entry->pts, sizeof(entry->pts), "%9ld", total_points(p));

	/* Save the current gold */
	strnfmt(entry->gold, sizeof(entry->gold), "%9ld", (long)p->au);

	/* Save the current turn */
	strnfmt(entry->turns, sizeof(entry->turns), "%9ld", (long)turn);

	/* Time of death */
	if (death_time)
		strftime(entry->day, sizeof(entry->day), "@%Y%m%d",
				 localtime(death_time));
	else
		my_strcpy(entry->day, "TODAY", sizeof(entry->day));

	/* Save the player name (15 chars) */
	strnfmt(entry->who, sizeof(entry->who), "%-.15s", p->full_name);

	/* Save the player info XXX XXX XXX */
	strnfmt(entry->uid, sizeof(entry->uid), "%7u", player_uid);
	strnfmt(entry->p_r, sizeof(entry->p_r), "%2d", p->race->ridx);
	strnfmt(entry->p_c, sizeof(entry->p_c), "%2d", p->class->cidx);

	/* Save the level and such */
	strnfmt(entry->cur_lev, sizeof(entry->cur_lev), "%3d", p->lev);
	strnfmt(entry->cur_dun, sizeof(entry->cur_dun), "%3d", p->depth);
	strnfmt(entry->max_lev, sizeof(entry->max_lev), "%3d", p->max_lev);
	strnfmt(entry->max_dun, sizeof(entry->max_dun), "%3d", p->max_depth);

	/* No cause of death */
	my_strcpy(entry->how, died_from, sizeof(entry->how));
}